

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_button_push_behavior(nk_context *ctx,nk_button_behavior behavior)

{
  int iVar1;
  long lVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5089,
                  "int nk_button_push_behavior(struct nk_context *, enum nk_button_behavior)");
  }
  iVar1 = (ctx->stacks).button_behaviors.head;
  lVar2 = (long)iVar1;
  if (lVar2 < 8) {
    (ctx->stacks).button_behaviors.head = iVar1 + 1;
    (ctx->stacks).button_behaviors.elements[lVar2].address = &ctx->button_behavior;
    (ctx->stacks).button_behaviors.elements[lVar2].old_value = ctx->button_behavior;
    ctx->button_behavior = behavior;
    return 1;
  }
  __assert_fail("button_stack->head < (int)(sizeof(button_stack->elements)/sizeof(button_stack->elements)[0])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x508d,"int nk_button_push_behavior(struct nk_context *, enum nk_button_behavior)")
  ;
}

Assistant:

NK_API int
nk_button_push_behavior(struct nk_context *ctx, enum nk_button_behavior behavior)
{
    struct nk_config_stack_button_behavior *button_stack;
    struct nk_config_stack_button_behavior_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    button_stack = &ctx->stacks.button_behaviors;
    NK_ASSERT(button_stack->head < (int)NK_LEN(button_stack->elements));
    if (button_stack->head >= (int)NK_LEN(button_stack->elements))
        return 0;

    element = &button_stack->elements[button_stack->head++];
    element->address = &ctx->button_behavior;
    element->old_value = ctx->button_behavior;
    ctx->button_behavior = behavior;
    return 1;
}